

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O1

void JsrtDebugUtils::AddLineColumnToObject
               (DynamicObject *object,FunctionBody *functionBody,int byteCodeOffset)

{
  uint32 uVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  uint32 local_28 [2];
  ULONG line;
  LONG col;
  
  if (functionBody != (FunctionBody *)0x0) {
    local_28[0] = 0;
    local_28[1] = 0;
    bVar2 = Js::FunctionBody::GetLineCharOffset
                      (functionBody,byteCodeOffset,local_28,(LONG *)(local_28 + 1),false);
    if (bVar2) {
      uVar1 = local_28[0];
      pSVar3 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      AddPropertyToObject(object,(JsrtDebugPropertyId)0x10,uVar1,pSVar3);
      uVar1 = local_28[1];
      pSVar3 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      AddPropertyToObject(object,(JsrtDebugPropertyId)0x3,uVar1,pSVar3);
    }
  }
  return;
}

Assistant:

void JsrtDebugUtils::AddLineColumnToObject(Js::DynamicObject* object, Js::FunctionBody* functionBody, int byteCodeOffset)
{
    if (functionBody != nullptr)
    {
        ULONG line = 0;
        LONG col = 0;
        if (functionBody->GetLineCharOffset(byteCodeOffset, &line, &col, false))
        {
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::line, (uint32) line, functionBody->GetScriptContext());
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::column, (int32) col, functionBody->GetScriptContext());
        }
    }
}